

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O1

void __thiscall SequenceMeaning::TracePointers(SequenceMeaning *this,function<void_(Sexp_**)> *func)

{
  pointer ppSVar1;
  Sexp **form;
  Sexp **ppSVar2;
  Sexp **local_38;
  
  ppSVar2 = (this->body).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->body).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 != ppSVar1) {
    do {
      local_38 = ppSVar2;
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001155ae;
      (*func->_M_invoker)((_Any_data *)func,&local_38);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 != ppSVar1);
  }
  local_38 = &this->final_form;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*func->_M_invoker)((_Any_data *)func,&local_38);
    return;
  }
LAB_001155ae:
  std::__throw_bad_function_call();
}

Assistant:

void TracePointers(std::function<void(Sexp **)> func) override {
    for (auto &form : body) {
      func(&form);
    }

    func(&final_form);
  }